

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

QSslCipher
QTlsBackend::createCiphersuite(QString *suiteName,SslProtocol protocol,QString *protocolString)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QLatin1StringView s_05;
  QLatin1StringView s_06;
  bool bVar1;
  qsizetype qVar2;
  pointer pQVar3;
  QString *in_RCX;
  SslProtocol in_EDX;
  QString *in_RSI;
  unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QSslCipher *ciph;
  QList<QStringView> bits;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffffc98;
  SplitBehaviorFlags in_stack_fffffffffffffc9c;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_fffffffffffffca0;
  int line;
  QString *in_stack_fffffffffffffca8;
  QString *t;
  QStringView *in_stack_fffffffffffffcb0;
  QString *this;
  QDebug *in_stack_fffffffffffffcb8;
  QString *this_00;
  QString *in_stack_fffffffffffffce8;
  bool local_2e9;
  bool local_2d1;
  QLatin1String *local_2a8;
  QLatin1String *local_288;
  QLatin1String *local_268;
  QLatin1String *local_248;
  QLatin1String *local_228;
  QLatin1String *local_208;
  QLatin1String *local_1e8;
  QLatin1String *local_1c8;
  QLatin1String *local_1a8;
  QLatin1String *local_188;
  QLatin1String *local_178;
  QLatin1String *local_168;
  QLatin1String *local_158;
  QDebug local_100 [5];
  QDebug local_d8 [5];
  QDebug local_b0;
  QLatin1StringView local_a8;
  QLatin1StringView local_98;
  QLatin1StringView local_88;
  QLatin1StringView local_78;
  QChar local_62;
  undefined1 local_60 [16];
  QList<QStringView> local_50;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)
   in_RDI._M_t.super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>.
   _M_t.super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
   super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = 0xaaaaaaaaaaaaaaaa;
  QSslCipher::QSslCipher((QSslCipher *)in_stack_fffffffffffffca0);
  qVar2 = QString::size(in_RSI);
  if (qVar2 != 0) {
    pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                       ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                        0x27962d);
    pQVar3->isNull = false;
    pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                       ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                        0x27964d);
    QString::operator=(&pQVar3->name,(QString *)in_RSI);
    pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                       ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                        0x27967c);
    pQVar3->protocol = in_EDX;
    pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                       ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                        0x2796a6);
    QString::operator=(&pQVar3->protocolString,in_RCX);
    local_50.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_50.d.ptr = (QStringView *)0xaaaaaaaaaaaaaaaa;
    local_50.d.size = -0x5555555555555556;
    std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
              ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)0x2796f4);
    QStringView::QStringView<QString,_true>(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    QChar::QChar<char16_t,_true>(&local_62,L'-');
    QFlags<Qt::SplitBehaviorFlags>::QFlags
              ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c
              );
    QStringView::split((QChar)(char16_t)&local_50,(QFlags_conflict *)local_60,
                       (uint)(ushort)local_62.ucs);
    qVar2 = QList<QStringView>::size(&local_50);
    if (1 < qVar2) {
      qVar2 = QList<QStringView>::size(&local_50);
      if ((qVar2 == 2) || (qVar2 = QList<QStringView>::size(&local_50), qVar2 == 3)) {
        QVar4 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
        pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                 operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                             *)0x2797c1);
        local_158 = (QLatin1String *)QVar4.m_size;
        QString::operator=(&pQVar3->keyExchangeMethod,local_158);
      }
      else {
        QList<QStringView>::front((QList<QStringView> *)0x2797ef);
        local_78 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
        bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffca0,
                             (QLatin1StringView *)
                             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        local_2d1 = true;
        if (!bVar1) {
          QList<QStringView>::front((QList<QStringView> *)0x27984a);
          local_88 = Qt::Literals::StringLiterals::operator____L1
                               ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0)
          ;
          local_2d1 = ::operator==((QStringView *)in_stack_fffffffffffffca0,
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        }
        if (local_2d1 == false) {
          QList<QStringView>::front((QList<QStringView> *)0x2798f8);
          local_98 = Qt::Literals::StringLiterals::operator____L1
                               ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0)
          ;
          bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffca0,
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          local_2e9 = true;
          if (!bVar1) {
            QList<QStringView>::front((QList<QStringView> *)0x27994a);
            local_a8 = Qt::Literals::StringLiterals::operator____L1
                                 ((char *)in_stack_fffffffffffffca8,
                                  (size_t)in_stack_fffffffffffffca0);
            local_2e9 = ::operator==((QStringView *)in_stack_fffffffffffffca0,
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          }
          if (local_2e9 == false) {
            local_18 = 0xaaaaaaaaaaaaaaaa;
            local_10 = 0xaaaaaaaaaaaaaaaa;
            QtPrivateLogging::lcSsl();
            anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::
            QLoggingCategoryMacroHolder
                      (in_stack_fffffffffffffca0,
                       (QLoggingCategory *)
                       CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
            while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
              anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x279a35);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffffcb0,
                         (char *)in_stack_fffffffffffffca8,
                         (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                         (char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                         (char *)0x279a4e);
              QMessageLogger::warning();
              QDebug::operator<<(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffce8);
              std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
              operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                         0x279a89);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
              QDebug::~QDebug(&local_b0);
              local_10 = local_10 & 0xffffffffffffff00;
            }
          }
          else {
            QVar4 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
            pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                     operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                 *)0x2799be);
            local_178 = (QLatin1String *)QVar4.m_size;
            QString::operator=(&pQVar3->keyExchangeMethod,local_178);
          }
        }
        else {
          QVar4 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
          pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                   operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                               *)0x2798ca);
          local_168 = (QLatin1String *)QVar4.m_size;
          QString::operator=(&pQVar3->keyExchangeMethod,local_168);
        }
      }
      qVar2 = QList<QStringView>::size(&local_50);
      if ((qVar2 == 2) || (qVar2 = QList<QStringView>::size(&local_50), qVar2 == 3)) {
        QVar4 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
        pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                 operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                             *)0x279b0e);
        local_188 = (QLatin1String *)QVar4.m_size;
        QString::operator=(&pQVar3->authenticationMethod,local_188);
      }
      else {
        std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                  ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                   0x279b3c);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
        QVar4.m_data = (char *)in_stack_fffffffffffffcb8;
        QVar4.m_size = (qsizetype)in_stack_fffffffffffffcb0;
        bVar1 = QString::contains((QString *)
                                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                  QVar4,CaseInsensitive);
        if (bVar1) {
          QVar4 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
          pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                   operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                               *)0x279bb9);
          local_1a8 = (QLatin1String *)QVar4.m_size;
          QString::operator=(&pQVar3->authenticationMethod,local_1a8);
        }
        else {
          pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                   operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                               *)0x279be7);
          in_stack_fffffffffffffce8 = &pQVar3->name;
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
          s.m_data = (char *)in_stack_fffffffffffffcb8;
          s.m_size = (qsizetype)in_stack_fffffffffffffcb0;
          bVar1 = QString::contains((QString *)
                                    CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),s,
                                    CaseInsensitive);
          if (bVar1) {
            QVar4 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
            pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                     operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                 *)0x279c64);
            local_1c8 = (QLatin1String *)QVar4.m_size;
            QString::operator=(&pQVar3->authenticationMethod,local_1c8);
          }
          else {
            local_28 = 0xaaaaaaaaaaaaaaaa;
            local_20 = 0xaaaaaaaaaaaaaaaa;
            QtPrivateLogging::lcSsl();
            anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::
            QLoggingCategoryMacroHolder
                      (in_stack_fffffffffffffca0,
                       (QLoggingCategory *)
                       CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
            while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
              anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x279cdb);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffffcb0,
                         (char *)in_stack_fffffffffffffca8,
                         (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                         (char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                         (char *)0x279cf4);
              QMessageLogger::warning();
              QDebug::operator<<(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffce8);
              std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
              operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                         0x279d2f);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
              QDebug::~QDebug(local_d8);
              local_20 = local_20 & 0xffffffffffffff00;
            }
          }
        }
      }
      std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)0x279d6d)
      ;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
      s_00.m_data = (char *)in_stack_fffffffffffffcb8;
      s_00.m_size = (qsizetype)in_stack_fffffffffffffcb0;
      bVar1 = QString::contains((QString *)
                                CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),s_00,
                                CaseInsensitive);
      if (bVar1) {
        QVar4 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
        pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                 operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                             *)0x279dea);
        local_1e8 = (QLatin1String *)QVar4.m_size;
        QString::operator=(&pQVar3->encryptionMethod,local_1e8);
        pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                 operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                             *)0x279e13);
        pQVar3->bits = 0x80;
        pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                 operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                             *)0x279e27);
        pQVar3->supportedBits = 0x80;
      }
      else {
        std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                  ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                   0x279e40);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
        s_01.m_data = (char *)in_stack_fffffffffffffcb8;
        s_01.m_size = (qsizetype)in_stack_fffffffffffffcb0;
        bVar1 = QString::contains((QString *)
                                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),s_01
                                  ,CaseInsensitive);
        if (bVar1) {
          QVar4 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
          pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                   operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                               *)0x279ebd);
          local_208 = (QLatin1String *)QVar4.m_size;
          QString::operator=(&pQVar3->encryptionMethod,local_208);
          pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                   operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                               *)0x279ee6);
          pQVar3->bits = 0xa8;
          pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                   operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                               *)0x279efa);
          pQVar3->supportedBits = 0xa8;
        }
        else {
          std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                    ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                     0x279f13);
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
          s_02.m_data = (char *)in_stack_fffffffffffffcb8;
          s_02.m_size = (qsizetype)in_stack_fffffffffffffcb0;
          bVar1 = QString::contains((QString *)
                                    CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                    s_02,CaseInsensitive);
          if (bVar1) {
            QVar4 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
            pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                     operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                 *)0x279f90);
            local_228 = (QLatin1String *)QVar4.m_size;
            QString::operator=(&pQVar3->encryptionMethod,local_228);
            pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                     operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                 *)0x279fb9);
            pQVar3->bits = 0x80;
            pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                     operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                 *)0x279fcd);
            pQVar3->supportedBits = 0x80;
          }
          else {
            std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::operator->
                      ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
                       0x279fe6);
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
            s_03.m_data = (char *)in_stack_fffffffffffffcb8;
            s_03.m_size = (qsizetype)in_stack_fffffffffffffcb0;
            bVar1 = QString::contains((QString *)
                                      CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                      s_03,CaseInsensitive);
            if (bVar1) {
              QVar4 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0
                                );
              pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                       operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                   *)0x27a063);
              local_248 = (QLatin1String *)QVar4.m_size;
              QString::operator=(&pQVar3->encryptionMethod,local_248);
              pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                       operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                   *)0x27a08c);
              pQVar3->bits = 0x100;
              pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                       operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                   *)0x27a0a0);
              pQVar3->supportedBits = 0x100;
            }
            else {
              pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                       operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                   *)0x27a0b9);
              this_00 = &pQVar3->name;
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
              s_04.m_data = (char *)this_00;
              s_04.m_size = (qsizetype)in_stack_fffffffffffffcb0;
              bVar1 = QString::contains((QString *)
                                        CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98
                                                ),s_04,CaseInsensitive);
              if (bVar1) {
                QVar4 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_fffffffffffffca8,
                                   (size_t)in_stack_fffffffffffffca0);
                pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                         ::operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                       *)0x27a136);
                local_268 = (QLatin1String *)QVar4.m_size;
                QString::operator=(&pQVar3->encryptionMethod,local_268);
                pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                         ::operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                       *)0x27a15f);
                pQVar3->bits = 0x100;
                pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                         ::operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                       *)0x27a173);
                pQVar3->supportedBits = 0x100;
              }
              else {
                pQVar3 = std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                         ::operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                       *)0x27a18c);
                this = &pQVar3->name;
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
                s_05.m_data = (char *)this_00;
                s_05.m_size = (qsizetype)this;
                bVar1 = QString::contains((QString *)
                                          CONCAT44(in_stack_fffffffffffffc9c,
                                                   in_stack_fffffffffffffc98),s_05,CaseInsensitive);
                if (bVar1) {
                  QVar4 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffffca8,
                                     (size_t)in_stack_fffffffffffffca0);
                  pQVar3 = std::
                           unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                           operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                       *)0x27a209);
                  local_288 = (QLatin1String *)QVar4.m_size;
                  QString::operator=(&pQVar3->encryptionMethod,local_288);
                  pQVar3 = std::
                           unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                           operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                       *)0x27a232);
                  pQVar3->bits = 0x100;
                  pQVar3 = std::
                           unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                           operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                       *)0x27a246);
                  pQVar3->supportedBits = 0x100;
                }
                else {
                  pQVar3 = std::
                           unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                           operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                       *)0x27a25f);
                  t = &pQVar3->name;
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)t,(size_t)in_stack_fffffffffffffca0);
                  s_06.m_data = (char *)this_00;
                  s_06.m_size = (qsizetype)this;
                  bVar1 = QString::contains((QString *)
                                            CONCAT44(in_stack_fffffffffffffc9c,
                                                     in_stack_fffffffffffffc98),s_06,CaseInsensitive
                                           );
                  if (bVar1) {
                    QVar4 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)t,(size_t)in_stack_fffffffffffffca0);
                    pQVar3 = std::
                             unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                             ::operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                           *)0x27a2dc);
                    local_2a8 = (QLatin1String *)QVar4.m_size;
                    QString::operator=(&pQVar3->encryptionMethod,local_2a8);
                  }
                  else {
                    local_38 = 0xaaaaaaaaaaaaaaaa;
                    local_30 = 0xaaaaaaaaaaaaaaaa;
                    QtPrivateLogging::lcSsl();
                    anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                    QLoggingCategoryMacroHolder
                              (in_stack_fffffffffffffca0,
                               (QLoggingCategory *)
                               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
                    while( true ) {
                      line = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
                      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                              operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_38);
                      if (!bVar1) break;
                      anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x27a353);
                      QMessageLogger::QMessageLogger
                                ((QMessageLogger *)this,(char *)t,line,
                                 (char *)CONCAT44(in_stack_fffffffffffffc9c,
                                                  in_stack_fffffffffffffc98),(char *)0x27a36c);
                      QMessageLogger::warning();
                      in_stack_fffffffffffffca0 =
                           (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                           QDebug::operator<<((QDebug *)this_00,(char *)in_stack_fffffffffffffce8);
                      std::unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>::
                      operator->((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                  *)0x27a3a7);
                      QDebug::operator<<((QDebug *)this,t);
                      QDebug::~QDebug(local_100);
                      local_30 = local_30 & 0xffffffffffffff00;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    QList<QStringView>::~QList((QList<QStringView> *)0x27a402);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)
           (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)
           in_RDI._M_t.
           super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
           super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

QSslCipher QTlsBackend::createCiphersuite(const QString &suiteName, QSsl::SslProtocol protocol,
                                          const QString &protocolString)
{
    QSslCipher ciph;

    if (!suiteName.size())
        return ciph;

    ciph.d->isNull = false;
    ciph.d->name = suiteName;
    ciph.d->protocol = protocol;
    ciph.d->protocolString = protocolString;

    const auto bits = QStringView{ciph.d->name}.split(u'-');
    if (bits.size() >= 2) {
        if (bits.size() == 2 || bits.size() == 3)
            ciph.d->keyExchangeMethod = "RSA"_L1;
        else if (bits.front() == "DH"_L1 || bits.front() == "DHE"_L1)
            ciph.d->keyExchangeMethod = "DH"_L1;
        else if (bits.front() == "ECDH"_L1 || bits.front() == "ECDHE"_L1)
            ciph.d->keyExchangeMethod = "ECDH"_L1;
        else
            qCWarning(lcSsl) << "Unknown Kx" << ciph.d->name;

        if (bits.size() == 2 || bits.size() == 3)
            ciph.d->authenticationMethod = "RSA"_L1;
        else if (ciph.d->name.contains("-ECDSA-"_L1))
            ciph.d->authenticationMethod = "ECDSA"_L1;
        else if (ciph.d->name.contains("-RSA-"_L1))
            ciph.d->authenticationMethod = "RSA"_L1;
        else
            qCWarning(lcSsl) << "Unknown Au" << ciph.d->name;

        if (ciph.d->name.contains("RC4-"_L1)) {
            ciph.d->encryptionMethod = "RC4(128)"_L1;
            ciph.d->bits = 128;
            ciph.d->supportedBits = 128;
        } else if (ciph.d->name.contains("DES-CBC3-"_L1)) {
            ciph.d->encryptionMethod = "3DES(168)"_L1;
            ciph.d->bits = 168;
            ciph.d->supportedBits = 168;
        } else if (ciph.d->name.contains("AES128-"_L1)) {
            ciph.d->encryptionMethod = "AES(128)"_L1;
            ciph.d->bits = 128;
            ciph.d->supportedBits = 128;
        } else if (ciph.d->name.contains("AES256-GCM"_L1)) {
            ciph.d->encryptionMethod = "AESGCM(256)"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("AES256-"_L1)) {
            ciph.d->encryptionMethod = "AES(256)"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("CHACHA20-"_L1)) {
            ciph.d->encryptionMethod = "CHACHA20"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("NULL-"_L1)) {
            ciph.d->encryptionMethod = "NULL"_L1;
        } else {
            qCWarning(lcSsl) << "Unknown Enc" << ciph.d->name;
        }
    }
    return ciph;
}